

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

Tag * __thiscall wasm::Module::getTag(Module *this,Name name)

{
  mapped_type pTVar1;
  mapped_type *ppTVar2;
  string *in_R8;
  Name name_00;
  long *local_50 [2];
  long local_40 [2];
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"getTag","");
  name_00.super_IString.str._M_str = (char *)local_50;
  ppTVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>>
                      ((wasm *)&this->tagsMap,name.super_IString.str._M_len,name_00,in_R8);
  pTVar1 = *ppTVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return pTVar1;
}

Assistant:

Tag* Module::getTag(Name name) {
  return getModuleElement(tagsMap, name, "getTag");
}